

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrsIntersect.cpp
# Opt level: O3

bool GeoCalcs::CrsIntersect
               (LLPoint *llPt1,double az13,double *az31,double *dist13,LLPoint *llPt2,double az23,
               double *az32,double *dist23,double dTol,LLPoint *llIntersect)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  bool bVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  LLPoint LVar13;
  InverseResult result;
  double distarray [2];
  double errarray [2];
  LLPoint newPt;
  LLPoint llInv;
  LLPOINT __tmp;
  LLPOINT __tmp_1;
  double local_168;
  double local_160;
  LLPoint local_148;
  LLPoint local_138;
  double local_120;
  double *local_118;
  uint uStack_10c;
  undefined1 local_108 [16];
  double local_f8;
  double local_f0;
  InverseResult local_e8;
  undefined1 local_c8 [16];
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double *local_90;
  double *local_88;
  double local_80;
  LLPoint local_78;
  LLPoint local_68 [3];
  
  local_138.latitude = llPt1->latitude;
  local_138.longitude = llPt1->longitude;
  local_148.latitude = llPt2->latitude;
  local_148.longitude = llPt2->longitude;
  local_e8.azimuth = 0.0;
  local_e8.reverseAzimuth = 0.0;
  local_e8.distance = 0.0;
  local_80 = dTol;
  DistVincenty(&local_138,&local_148,&local_e8);
  dVar12 = SignAzimuthDifference(az13,local_e8.azimuth);
  local_108._8_4_ = extraout_XMM0_Dc;
  local_108._0_8_ = dVar12;
  local_108._12_4_ = extraout_XMM0_Dd;
  uStack_10c = extraout_XMM0_Dd & 0x7fffffff;
  local_118 = (double *)((ulong)dVar12 & 0x7fffffffffffffff);
  dVar12 = SignAzimuthDifference(local_e8.reverseAzimuth,az23);
  local_c8._8_4_ = extraout_XMM0_Dc_00;
  local_c8._0_8_ = dVar12;
  local_c8._12_4_ = extraout_XMM0_Dd_00;
  dVar1 = sin((double)local_118);
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    dVar1 = sin(ABS(dVar12));
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      return false;
    }
  }
  dVar1 = cos((double)local_108._0_8_);
  local_108._0_8_ = dVar1;
  local_120 = sin((double)local_118);
  local_118 = (double *)cos((double)local_c8._0_8_);
  dVar12 = sin(ABS(dVar12));
  dVar1 = local_120 * dVar12;
  local_c8._0_8_ = dVar12;
  dVar12 = cos(local_e8.distance / kSphereRadius);
  local_f0 = acos(dVar12 * dVar1 - (double)local_108._0_8_ * (double)local_118);
  dVar12 = cos(local_f0);
  local_f0 = sin(local_f0);
  local_f8 = kSphereRadius;
  dVar1 = acos(((double)local_118 * dVar12 + (double)local_108._0_8_) /
               ((double)local_c8._0_8_ * local_f0));
  local_c8._0_8_ = dVar1 * local_f8;
  local_f8 = kSphereRadius;
  dVar12 = acos(((double)local_108._0_8_ * dVar12 + (double)local_118) / (local_120 * local_f0));
  bVar4 = false;
  if ((!NAN((double)local_c8._0_8_)) && (bVar4 = false, !NAN(local_f8 * dVar12))) {
    local_118 = az32;
    LVar13 = DestVincenty(&local_138,az13,local_f8 * dVar12);
    llIntersect->latitude = LVar13.latitude;
    llIntersect->longitude = LVar13.longitude;
    DistVincenty(&local_138,llIntersect,&local_e8);
    *dist13 = local_e8.distance;
    local_68[0].latitude = -llIntersect->latitude;
    local_68[0].longitude = llIntersect->longitude + 3.141592653589793 + -6.283185307179586;
    DistVincenty(&local_138,local_68,&local_e8);
    local_168 = az13;
    local_160 = az23;
    if (local_e8.distance < *dist13) {
      llIntersect->latitude = local_68[0].latitude;
      llIntersect->longitude = local_68[0].longitude;
      *dist13 = local_e8.distance;
      *az31 = local_e8.reverseAzimuth;
      local_168 = az13 + 3.141592653589793;
      local_160 = az23 + 3.141592653589793;
    }
    DistVincenty(&local_148,llIntersect,&local_e8);
    *dist23 = local_e8.distance;
    if (1852.0 < *dist13 || *dist13 == 1852.0) {
      uVar10 = SUB84(local_168,0);
      uVar11 = (undefined4)((ulong)local_168 >> 0x20);
      dVar12 = local_e8.distance;
    }
    else {
      LVar13 = DestVincenty(&local_138,local_168 + 3.141592653589793,1852.0);
      local_138.latitude = LVar13.latitude;
      local_138.longitude = LVar13.longitude;
      DistVincenty(&local_138,llIntersect,&local_e8);
      uVar10 = SUB84(local_e8.azimuth,0);
      uVar11 = (undefined4)((ulong)local_e8.azimuth >> 0x20);
      dVar12 = *dist23;
    }
    uVar6 = SUB84(local_160,0);
    uVar7 = (undefined4)((ulong)local_160 >> 0x20);
    local_168 = (double)CONCAT44(uVar11,uVar10);
    if (dVar12 < 1852.0) {
      LVar13 = DestVincenty(&local_148,local_160 + 3.141592653589793,1852.0);
      local_148.latitude = LVar13.latitude;
      local_148.longitude = LVar13.longitude;
      DistVincenty(&local_148,llIntersect,&local_e8);
      uVar6 = SUB84(local_e8.azimuth,0);
      uVar7 = (undefined4)((ulong)local_e8.azimuth >> 0x20);
      dVar12 = *dist23;
    }
    dVar2 = local_138.longitude;
    dVar1 = local_138.latitude;
    local_120 = *dist13;
    uVar8 = SUB84(local_120,0);
    uVar9 = (undefined4)((ulong)local_120 >> 0x20);
    local_108._0_8_ = dVar12;
    if (local_120 <= dVar12) {
      local_168 = (double)CONCAT44(uVar7,uVar6);
    }
    else {
      local_138.latitude = local_148.latitude;
      local_138.longitude = local_148.longitude;
      local_148.latitude = dVar1;
      local_148.longitude = dVar2;
      *dist13 = dVar12;
      uVar8 = SUB84(dVar12,0);
      uVar9 = (undefined4)((ulong)dVar12 >> 0x20);
      uVar10 = uVar6;
      uVar11 = uVar7;
    }
    local_b8 = (double)CONCAT44(uVar9,uVar8);
    dVar12 = (double)CONCAT44(uVar9,uVar8) * 1.01;
    local_b0 = dVar12;
    local_90 = az31;
    local_88 = dist23;
    LVar13 = DestVincenty(&local_138,(double)CONCAT44(uVar11,uVar10),(double)CONCAT44(uVar9,uVar8));
    llIntersect->latitude = LVar13.latitude;
    llIntersect->longitude = LVar13.longitude;
    DistVincenty(&local_148,llIntersect,&local_e8);
    local_a8 = SignAzimuthDifference(local_e8.azimuth,local_168);
    LVar13 = DestVincenty(&local_138,(double)CONCAT44(uVar11,uVar10),dVar12);
    llIntersect->latitude = LVar13.latitude;
    llIntersect->longitude = LVar13.longitude;
    DistVincenty(&local_148,llIntersect,&local_e8);
    local_a0 = SignAzimuthDifference(local_e8.azimuth,local_168);
    uVar6 = 0;
    uVar7 = 0;
    for (uVar5 = 0;
        (uVar5 == 0 ||
        ((local_80 <= (double)CONCAT44(uVar7,uVar6) && (double)CONCAT44(uVar7,uVar6) != local_80 &&
         (uVar5 < 0x10)))); uVar5 = uVar5 + 1) {
      FindLinearRoot(&local_b8,&local_a8,dist13);
      if (NAN(*dist13)) goto LAB_00156f29;
      LVar13 = DestVincenty(&local_138,(double)CONCAT44(uVar11,uVar10),*dist13);
      local_78.latitude = LVar13.latitude;
      local_78.longitude = LVar13.longitude;
      DistVincenty(&local_148,&local_78,&local_e8);
      local_a8 = local_a0;
      local_a0 = SignAzimuthDifference(local_e8.azimuth,local_168);
      local_b8 = local_b0;
      local_b0 = *dist13;
      DistVincenty(&local_78,llIntersect,&local_e8);
      uVar6 = SUB84(local_e8.distance,0);
      uVar7 = (undefined4)((ulong)local_e8.distance >> 0x20);
      llIntersect->latitude = local_78.latitude;
      llIntersect->longitude = local_78.longitude;
    }
    if ((0xf < uVar5) &&
       (1e-08 <= (double)CONCAT44(uVar7,uVar6) && (double)CONCAT44(uVar7,uVar6) != 1e-08)) {
      return false;
    }
LAB_00156f29:
    pdVar3 = local_88;
    dVar1 = local_138.longitude;
    dVar12 = local_138.latitude;
    if ((double)local_108._0_8_ < local_120) {
      local_138.latitude = local_148.latitude;
      local_138.longitude = local_148.longitude;
      local_148.latitude = dVar12;
      local_148.longitude = dVar1;
      *dist13 = *local_88;
    }
    DistVincenty(llIntersect,&local_138,&local_e8);
    *local_90 = local_e8.azimuth;
    *dist13 = local_e8.distance;
    DistVincenty(llIntersect,&local_148,&local_e8);
    *local_118 = local_e8.azimuth;
    *pdVar3 = local_e8.distance;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool CrsIntersect(const LLPoint &llPt1, double az13,
                      double &az31, double &dist13, const LLPoint &llPt2, double az23,
                      double &az32, double &dist23, double dTol, LLPoint &llIntersect)
    {
        LLPoint pt1 = llPt1;
        LLPoint pt2 = llPt2;

        InverseResult result;
        DistVincenty(pt1, pt2, result);

        double angle1 = fabs(SignAzimuthDifference(az13, result.azimuth));
        double angle2 = fabs(SignAzimuthDifference(result.reverseAzimuth, az23));
        if (angle1 < 0.0 && angle2 < 0.0)
        {
            angle1 = -angle1;
            angle2 = -angle2;
        }

        if (sin(angle1) == 0.0 && sin(angle2) == 0.0)
            return false;

        // step 7
        // locate approx intersection of point3 using spherical earth model. Section 3.2

        const double cosA = cos(angle1);
        const double sinA = sin(angle1);
        const double cosB = cos(angle2);
        const double sinB = sin(angle2);

        const double C = acos(-cosA * cosB + sinA * sinB * cos(result.distance / kSphereRadius));
        const double cosC = cos(C);
        const double sinC = sin(C);
        const double a = kSphereRadius * acos((cosA + cosB * cosC) / (sinB * sinC));
        const double b = kSphereRadius * acos((cosB + cosA * cosC) / (sinA * sinC));

        if (std::isnan(a) || std::isnan(b))
            return false;

        llIntersect = DestVincenty(pt1, az13, b);
        DistVincenty(pt1, llIntersect, result);
        dist13 = result.distance;

        LLPoint llInv = llIntersect;
        llInv.latitude = -llInv.latitude;
        llInv.longitude = llInv.longitude + M_PI - M_2PI;
        DistVincenty(pt1, llInv, result);

        if (dist13 > result.distance)
        {
            llIntersect = llInv;
            dist13 = result.distance;
            az31 = result.reverseAzimuth;
            az13 = az13 + M_PI;
            az23 = az23 + M_PI;
        }

        DistVincenty(pt2, llIntersect, result);
        dist23 = result.distance;

        if (dist13 < NmToMeters(1))
        {
            pt1 = DestVincenty(pt1, az13 + M_PI, NmToMeters(1.0));
            DistVincenty(pt1, llIntersect, result);
            az13 = result.azimuth;
        }
        if (dist23 < NmToMeters(1))
        {
            pt2 = DestVincenty(pt2, az23 + M_PI, NmToMeters(1.0));
            DistVincenty(pt2, llIntersect, result);
            az23 = result.azimuth;
        }

        bool bSwapped = false;
        if (dist23 < dist13)
        {
            std::swap(pt1, pt2);
            std::swap(az13, az23);
            dist13 = dist23;
            bSwapped = true;
        }

        double distarray[2], errarray[2];
        distarray[0] = dist13;
        distarray[1] = 1.01 * dist13;

        llIntersect = DestVincenty(pt1, az13, dist13);
        DistVincenty(pt2, llIntersect, result);
        errarray[0] = SignAzimuthDifference(result.azimuth, az23);

        llIntersect = DestVincenty(pt1, az13, distarray[1]);
        DistVincenty(pt2, llIntersect, result);
        errarray[1] = SignAzimuthDifference(result.azimuth, az23);

        const int nMaxCount = 15;
        double dErr = 0.0;
        int k = 0;
        while (k == 0 || ((dErr > dTol) && (k <= nMaxCount)))
        {
            FindLinearRoot(distarray, errarray, dist13);
            if (std::isnan(dist13))
                break;

            LLPoint newPt = DestVincenty(pt1, az13, dist13);
            DistVincenty(pt2, newPt, result);
            errarray[0] = errarray[1];
            errarray[1] = SignAzimuthDifference(result.azimuth, az23);
            distarray[0] = distarray[1];
            distarray[1] = dist13;

            DistVincenty(newPt, llIntersect, result);
            dErr = result.distance;
            llIntersect = newPt;
            k++;
        }

        // display if k == maxinteratorcount (10) and show error message
        // because results might not have converged.
        if (k > nMaxCount && dErr > 1e-8)
            return false;

        if (bSwapped)
        {
            std::swap(pt1, pt2);
            std::swap(az13, az23);
            dist13 = dist23;
        }
        DistVincenty(llIntersect, pt1, result);
        az31 = result.azimuth;
        dist13 = result.distance;

        DistVincenty(llIntersect, pt2, result);
        az32 = result.azimuth;
        dist23 = result.distance;

        return true;
    }